

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void crnd::crnd_set_memory_callbacks
               (crnd_realloc_func pRealloc,crnd_msize_func pMSize,void *pUser_data)

{
  void *pUser_data_local;
  crnd_msize_func pMSize_local;
  crnd_realloc_func pRealloc_local;
  
  if ((pRealloc == (crnd_realloc_func)0x0) ||
     (g_pRealloc = pRealloc, g_pMSize = pMSize, g_pUser_data = pUser_data,
     pMSize == (crnd_msize_func)0x0)) {
    g_pRealloc = crnd_default_realloc;
    g_pMSize = crnd_default_msize;
    g_pUser_data = (void *)0x0;
  }
  return;
}

Assistant:

void crnd_set_memory_callbacks(crnd_realloc_func pRealloc, crnd_msize_func pMSize, void* pUser_data)
    {
        if ((!pRealloc) || (!pMSize))
        {
            g_pRealloc = crnd_default_realloc;
            g_pMSize = crnd_default_msize;
            g_pUser_data = NULL;
        }
        else
        {
            g_pRealloc = pRealloc;
            g_pMSize = pMSize;
            g_pUser_data = pUser_data;
        }
    }